

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)29>_> *
vk::anon_unknown_0::createCallback
          (Move<vk::Handle<(vk::HandleType)29>_> *__return_storage_ptr__,InstanceInterface *vki,
          VkInstance instance,MessageList *messageList)

{
  undefined1 local_58 [8];
  VkDebugReportCallbackCreateInfoEXT createInfo;
  VkDebugReportFlagsEXT allFlags;
  MessageList *messageList_local;
  VkInstance instance_local;
  InstanceInterface *vki_local;
  
  createInfo.pUserData._4_4_ = 0x1f;
  local_58._0_4_ = VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0x1f;
  createInfo._16_8_ = debugReportCallback;
  createInfo.pfnCallback = (PFN_vkDebugReportCallbackEXT)messageList;
  createDebugReportCallbackEXT
            (__return_storage_ptr__,vki,instance,(VkDebugReportCallbackCreateInfoEXT *)local_58,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDebugReportCallbackEXT> createCallback (const InstanceInterface&				vki,
											   VkInstance							instance,
											   DebugReportRecorder::MessageList*	messageList)
{
	const VkDebugReportFlagsEXT					allFlags	= VK_DEBUG_REPORT_INFORMATION_BIT_EXT
															| VK_DEBUG_REPORT_WARNING_BIT_EXT
															| VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT
															| VK_DEBUG_REPORT_ERROR_BIT_EXT
															| VK_DEBUG_REPORT_DEBUG_BIT_EXT;

	const VkDebugReportCallbackCreateInfoEXT	createInfo	=
	{
		VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT,
		DE_NULL,
		allFlags,
		debugReportCallback,
		messageList
	};

	return createDebugReportCallbackEXT(vki, instance, &createInfo);
}